

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

bool __thiscall
HEkk::reinvertOnNumericalTrouble
          (HEkk *this,string *method_name,double *numerical_trouble_measure,double alpha_from_col,
          double alpha_from_row,double numerical_trouble_tolerance)

{
  uint uVar1;
  bool reinvert;
  double dVar2;
  double dVar3;
  double dVar4;
  string local_48;
  
  dVar3 = ABS(alpha_from_col);
  dVar2 = ABS(alpha_from_row);
  dVar4 = dVar2;
  if (dVar3 <= dVar2) {
    dVar4 = dVar3;
  }
  dVar4 = ABS(dVar3 - dVar2) / dVar4;
  *numerical_trouble_measure = dVar4;
  uVar1 = (this->info_).update_count;
  reinvert = 0 < (int)uVar1 && numerical_trouble_tolerance < dVar4;
  std::__cxx11::string::string((string *)&local_48,(string *)method_name);
  debugReportReinvertOnNumericalTrouble
            (this,&local_48,*numerical_trouble_measure,alpha_from_col,alpha_from_row,
             numerical_trouble_tolerance,reinvert);
  std::__cxx11::string::~string((string *)&local_48);
  if (0 < (int)uVar1 && numerical_trouble_tolerance < dVar4) {
    dVar4 = (this->info_).factor_pivot_threshold;
    dVar2 = 0.1;
    if (((dVar4 < 0.1) || (dVar2 = 0.5, uVar1 < 10 && dVar4 < 0.5)) &&
       ((dVar4 = dVar4 * 5.0, dVar2 < dVar4 || ((dVar2 = dVar4, dVar4 != 0.0 || (NAN(dVar4))))))) {
      highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kWarning,
                   "   Increasing Markowitz threshold to %g\n");
      (this->info_).factor_pivot_threshold = dVar2;
      HSimplexNla::setPivotThreshold(&this->simplex_nla_,dVar2);
    }
  }
  return reinvert;
}

Assistant:

bool HEkk::reinvertOnNumericalTrouble(
    const std::string method_name, double& numerical_trouble_measure,
    const double alpha_from_col, const double alpha_from_row,
    const double numerical_trouble_tolerance) {
  double abs_alpha_from_col = fabs(alpha_from_col);
  double abs_alpha_from_row = fabs(alpha_from_row);
  double min_abs_alpha = min(abs_alpha_from_col, abs_alpha_from_row);
  double abs_alpha_diff = fabs(abs_alpha_from_col - abs_alpha_from_row);
  numerical_trouble_measure = abs_alpha_diff / min_abs_alpha;
  const HighsInt update_count = info_.update_count;
  // Reinvert if the relative difference is large enough, and updates have been
  // performed
  const bool numerical_trouble =
      numerical_trouble_measure > numerical_trouble_tolerance;
  const bool reinvert = numerical_trouble && update_count > 0;
  debugReportReinvertOnNumericalTrouble(method_name, numerical_trouble_measure,
                                        alpha_from_col, alpha_from_row,
                                        numerical_trouble_tolerance, reinvert);
  if (reinvert) {
    // Consider increasing the Markowitz multiplier
    const double current_pivot_threshold = info_.factor_pivot_threshold;
    double new_pivot_threshold = 0;
    if (current_pivot_threshold < kDefaultPivotThreshold) {
      // Threshold is below default value, so increase it
      new_pivot_threshold =
          min(current_pivot_threshold * kPivotThresholdChangeFactor,
              kDefaultPivotThreshold);
    } else if (current_pivot_threshold < kMaxPivotThreshold) {
      // Threshold is below max value, so increase it if few updates have been
      // performed
      if (update_count < 10)
        new_pivot_threshold =
            min(current_pivot_threshold * kPivotThresholdChangeFactor,
                kMaxPivotThreshold);
    }
    if (new_pivot_threshold) {
      highsLogUser(options_->log_options, HighsLogType::kWarning,
                   "   Increasing Markowitz threshold to %g\n",
                   new_pivot_threshold);
      info_.factor_pivot_threshold = new_pivot_threshold;
      simplex_nla_.setPivotThreshold(new_pivot_threshold);
    }
  }
  return reinvert;
}